

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VCompare(N_Vector X,N_Vector Z,sunindextype param_3,int myid)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  sunrealtype sVar8;
  double dVar9;
  timespec spec;
  timespec local_40;
  
  if (param_3 < 3) {
    printf("Error Test_N_VCompare: Local vector length is %ld, length must be >= 3\n",param_3);
    iVar6 = 1;
  }
  else {
    uVar5 = 0;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5;
      set_element(Z,uVar5,-1.0);
      set_element(X,uVar5,*(sunrealtype *)
                           ((long)&DAT_00114ed8 +
                           uVar5 * 8 +
                           (SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffffe) *
                           -0xc));
      uVar5 = uVar5 + 1;
    } while (param_3 != uVar5);
    clock_gettime(1,&local_40);
    lVar3 = local_40.tv_sec - base_time_tv_sec;
    dVar9 = (double)local_40.tv_nsec;
    N_VCompare(0x3ff0000000000000,X,Z);
    sync_device(X);
    clock_gettime(1,&local_40);
    lVar4 = local_40.tv_sec - base_time_tv_sec;
    uVar5 = 0;
    bVar2 = false;
    do {
      sVar8 = get_element(Z,uVar5);
      if ((uVar5 % 3 == 2) || (uVar5 % 3 == 1)) {
        bVar7 = sVar8 == 1.0;
      }
      else {
        bVar7 = sVar8 == 0.0;
      }
      if ((!bVar7) || (NAN(sVar8))) {
        bVar2 = true;
      }
      uVar5 = uVar5 + 1;
    } while (param_3 != uVar5);
    if (bVar2) {
      printf(">>> FAILED test -- N_VCompare, Proc %d \n");
      iVar6 = 1;
    }
    else {
      iVar6 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VCompare ");
        iVar6 = 0;
      }
    }
    max_time(X,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar4) -
               (dVar9 / 1000000000.0 + (double)lVar3));
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VCompare");
    }
  }
  return iVar6;
}

Assistant:

int Test_N_VCompare(N_Vector X, N_Vector Z, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunindextype i;

  if (local_length < 3)
  {
    printf("Error Test_N_VCompare: Local vector length is %ld, length must be "
           ">= 3\n",
           (long int)local_length);
    return (1);
  }

  /* fill vector data */
  for (i = 0; i < local_length; i++)
  {
    set_element(Z, i, NEG_ONE);

    switch (i % 3)
    {
    case 0:
      /* abs(X[i]) < c */
      set_element(X, i, ZERO);
      break;

    case 1:
      /* abs(X[i]) = c */
      set_element(X, i, NEG_ONE);
      break;

    case 2:
      /* abs(X[i]) > c */
      set_element(X, i, NEG_TWO);
      break;
    }
  }

  start_time = get_time();
  N_VCompare(ONE, X, Z);
  sync_device(X);
  stop_time = get_time();

  /* check return vector */
  for (i = 0; i < local_length; i++)
  {
    switch (i % 3)
    {
    case 0:
      /* Z[i] == 0 */
      if (get_element(Z, i) != ZERO) { failure = 1; }
      break;

    case 1:
      /* Z[i] == 1 */
      if (get_element(Z, i) != ONE) { failure = 1; }
      break;

    case 2:
      /* Z[i] == 1 */
      if (get_element(Z, i) != ONE) { failure = 1; }
      break;
    }
  }

  if (failure)
  {
    printf(">>> FAILED test -- N_VCompare, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VCompare \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VCompare", maxt);

  return (fails);
}